

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_graph_manager.cpp
# Opt level: O2

GenerateJoinRelation __thiscall
duckdb::QueryGraphManager::GenerateJoins
          (QueryGraphManager *this,
          vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
          *extracted_relations,JoinRelationSet *set)

{
  pointer *this_00;
  idx_t iVar1;
  pointer poVar2;
  pointer puVar3;
  idx_t iVar4;
  unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true> *puVar5;
  _Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> _Var6;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var7;
  long lVar8;
  _Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false> _Var9;
  undefined8 uVar10;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> uVar11;
  bool bVar12;
  LogicalOperatorType LVar13;
  _Hashtable<std::reference_wrapper<duckdb::JoinRelationSet>,_std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_01;
  const_iterator cVar14;
  pointer pDVar15;
  JoinRelationSet *pJVar16;
  reference pvVar17;
  NeighborInfo *pNVar18;
  reference pvVar19;
  FilterInfo *pFVar20;
  reference __b;
  BoundConjunctionExpression *pBVar21;
  pointer pLVar22;
  type pFVar23;
  reference pvVar24;
  pointer pFVar25;
  JoinRelationSet *pJVar26;
  pointer pEVar27;
  BoundComparisonExpression *pBVar28;
  pointer pLVar29;
  InternalException *this_02;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> in_RCX;
  ulong __n;
  pointer puVar30;
  byte bVar31;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var32;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var33;
  unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true> *this_03;
  pointer poVar34;
  unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true> *this_04;
  GenerateJoinRelation GVar35;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_110;
  undefined1 local_108 [24];
  _Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false> local_f0;
  undefined1 local_e8 [16];
  JoinCondition cond;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_b8;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_b0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_a8;
  __node_base local_a0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_98;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_90;
  value_type chosen_filter;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_80;
  __uniq_ptr_impl<duckdb::JoinRelationSet,_std::default_delete<duckdb::JoinRelationSet>_> local_78;
  optional_ptr<duckdb::JoinRelationSet,_true> result_relation;
  optional_ptr<duckdb::JoinRelationSet,_true> left_node;
  optional_ptr<duckdb::JoinRelationSet,_true> right_node;
  
  left_node.ptr = (JoinRelationSet *)0x0;
  right_node.ptr = (JoinRelationSet *)0x0;
  result_relation.ptr = (JoinRelationSet *)0x0;
  local_110._M_head_impl = (LogicalOperator *)0x0;
  this_01 = &optional_ptr<const_std::unordered_map<std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>_>,_true>
             ::operator->((optional_ptr<const_std::unordered_map<std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>_>,_true>
                           *)(extracted_relations + 9))->_M_h;
  cond.left.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
       in_RCX._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  cVar14 = ::std::
           _Hashtable<std::reference_wrapper<duckdb::JoinRelationSet>,_std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(this_01,(key_type *)&cond);
  optional_ptr<const_std::unordered_map<std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>_>,_true>
  ::operator->((optional_ptr<const_std::unordered_map<std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>_>,_true>
                *)(extracted_relations + 9));
  if (cVar14.
      super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    this_02 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&cond,"Join Order Optimizer Error: No full plan was created",
               (allocator *)local_108);
    InternalException::InternalException(this_02,(string *)&cond);
    __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this_04 = (unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true> *)
            ((long)cVar14.
                   super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_true>
                   ._M_cur + 0x10);
  pDVar15 = unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::
            operator->(this_04);
  if (pDVar15->is_leaf == false) {
    unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::operator->
              (this_04);
    GenerateJoins((QueryGraphManager *)local_108,extracted_relations,set);
    unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::operator->
              (this_04);
    GenerateJoins((QueryGraphManager *)local_e8,extracted_relations,set);
    pDVar15 = unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::
              operator->(this_04);
    pNVar18 = optional_ptr<duckdb::NeighborInfo,_true>::operator->(&pDVar15->info);
    if ((pNVar18->filters).
        super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
        .
        super__Vector_base<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pNVar18->filters).
        super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
        .
        super__Vector_base<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pLVar22 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                              *)(local_108 + 8));
      iVar4 = pLVar22->estimated_cardinality;
      pLVar22 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                              *)(local_e8 + 8));
      local_78._M_t.
      super__Tuple_impl<0UL,_duckdb::JoinRelationSet_*,_std::default_delete<duckdb::JoinRelationSet>_>
      .super__Head_base<0UL,_duckdb::JoinRelationSet_*,_false>._M_head_impl =
           (tuple<duckdb::JoinRelationSet_*,_std::default_delete<duckdb::JoinRelationSet>_>)
           (tuple<duckdb::JoinRelationSet_*,_std::default_delete<duckdb::JoinRelationSet>_>)
           local_108._8_8_;
      iVar1 = pLVar22->estimated_cardinality;
      local_108._8_8_ = (LogicalOperator *)0x0;
      local_80._M_head_impl = (LogicalOperator *)local_e8._8_8_;
      local_e8._8_8_ = (LogicalOperator *)0x0;
      LogicalCrossProduct::Create
                ((LogicalCrossProduct *)&cond,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_78,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_80);
      uVar11 = cond.left;
      _Var32._M_head_impl = local_110._M_head_impl;
      cond.left.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
           )0x0;
      local_110._M_head_impl =
           (LogicalOperator *)
           uVar11.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      if ((_Var32._M_head_impl != (LogicalOperator *)0x0) &&
         ((**(code **)((long)(((unsafe_unique_array<idx_t> *)
                              &(_Var32._M_head_impl)->_vptr_LogicalOperator)->
                             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                             )._M_t.
                             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                             .super__Head_base<0UL,_unsigned_long_*,_false> + 8))(),
         cond.left.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
         (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
         0x0)) {
        (**(code **)(*(long *)cond.left.
                              super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 8))
                  ();
      }
      cond.left.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
           )0x0;
      if (local_80._M_head_impl != (LogicalOperator *)0x0) {
        (*(code *)((_Hash_node_base *)(local_80._M_head_impl)->_vptr_LogicalOperator)[1]._M_nxt)();
      }
      local_80._M_head_impl = (LogicalOperator *)0x0;
      if ((_Tuple_impl<0UL,_duckdb::JoinRelationSet_*,_std::default_delete<duckdb::JoinRelationSet>_>
           )local_78._M_t.
            super__Tuple_impl<0UL,_duckdb::JoinRelationSet_*,_std::default_delete<duckdb::JoinRelationSet>_>
            .super__Head_base<0UL,_duckdb::JoinRelationSet_*,_false>._M_head_impl !=
          (JoinRelationSet *)0x0) {
        (**(code **)(*(long *)local_78._M_t.
                              super__Tuple_impl<0UL,_duckdb::JoinRelationSet_*,_std::default_delete<duckdb::JoinRelationSet>_>
                              .super__Head_base<0UL,_duckdb::JoinRelationSet_*,_false>._M_head_impl
                    + 8))();
      }
      local_78._M_t.
      super__Tuple_impl<0UL,_duckdb::JoinRelationSet_*,_std::default_delete<duckdb::JoinRelationSet>_>
      .super__Head_base<0UL,_duckdb::JoinRelationSet_*,_false>._M_head_impl =
           (tuple<duckdb::JoinRelationSet_*,_std::default_delete<duckdb::JoinRelationSet>_>)0x0;
      pLVar22 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                              *)&local_110);
      LogicalOperator::SetEstimatedCardinality(pLVar22,iVar4 * iVar1);
    }
    else {
      pDVar15 = unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::
                operator->(this_04);
      pNVar18 = optional_ptr<duckdb::NeighborInfo,_true>::operator->(&pDVar15->info);
      pvVar19 = ::std::
                vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
                ::at(&(pNVar18->filters).
                      super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
                     ,0);
      chosen_filter.ptr = pvVar19->ptr;
      __n = 0;
      while( true ) {
        pDVar15 = unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::
                  operator->(this_04);
        pNVar18 = optional_ptr<duckdb::NeighborInfo,_true>::operator->(&pDVar15->info);
        if ((ulong)((long)(pNVar18->filters).
                          super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
                          .
                          super__Vector_base<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pNVar18->filters).
                          super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
                          .
                          super__Vector_base<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) <= __n) break;
        pDVar15 = unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::
                  operator->(this_04);
        pNVar18 = optional_ptr<duckdb::NeighborInfo,_true>::operator->(&pDVar15->info);
        pvVar19 = ::std::
                  vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
                  ::at(&(pNVar18->filters).
                        super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
                       ,__n);
        pFVar20 = optional_ptr<duckdb::FilterInfo,_true>::operator->(pvVar19);
        if (pFVar20->join_type == INNER) {
          pDVar15 = unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::
                    operator->(this_04);
          pNVar18 = optional_ptr<duckdb::NeighborInfo,_true>::operator->(&pDVar15->info);
          pvVar19 = ::std::
                    vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
                    ::at(&(pNVar18->filters).
                          super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
                         ,__n);
          chosen_filter.ptr = pvVar19->ptr;
          break;
        }
        __n = __n + 1;
      }
      pFVar20 = optional_ptr<duckdb::FilterInfo,_true>::operator->(&chosen_filter);
      make_uniq<duckdb::LogicalComparisonJoin,duckdb::JoinType&>
                ((duckdb *)&local_f0,&pFVar20->join_type);
      pLVar29 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                              *)&local_f0);
      ::std::
      vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                  *)&(pLVar29->super_LogicalJoin).super_LogicalOperator.children,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)(local_108 + 8));
      pLVar29 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                              *)&local_f0);
      ::std::
      vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                  *)&(pLVar29->super_LogicalJoin).super_LogicalOperator.children,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)(local_e8 + 8));
      pDVar15 = unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::
                operator->(this_04);
      pNVar18 = optional_ptr<duckdb::NeighborInfo,_true>::operator->(&pDVar15->info);
      poVar2 = (pNVar18->filters).
               super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
               .
               super__Vector_base<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (poVar34 = (pNVar18->filters).
                     super_vector<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
                     .
                     super__Vector_base<duckdb::optional_ptr<duckdb::FilterInfo,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FilterInfo,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          _Var9._M_head_impl = local_f0._M_head_impl, _Var32._M_head_impl = local_110._M_head_impl,
          poVar34 != poVar2; poVar34 = poVar34 + 1) {
        pFVar20 = poVar34->ptr;
        pvVar24 = ::std::
                  vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
                  ::at((vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>_>_>
                        *)&extracted_relations[10].
                           super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,pFVar20->filter_index);
        pFVar25 = unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>::
                  operator->(pvVar24);
        local_108._16_8_ =
             (pFVar25->filter).
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>;
        (pFVar25->filter).
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false> =
             (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
        pJVar16 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*
                            ((optional_ptr<duckdb::JoinRelationSet,_true> *)local_108);
        pJVar26 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*(&pFVar20->left_set);
        bVar12 = JoinRelationSet::IsSubset(pJVar16,pJVar26);
        if (bVar12) {
LAB_012259dd:
          bVar12 = false;
        }
        else {
          bVar12 = true;
          if ((byte)(pFVar20->join_type - SEMI) < 2) {
            pLVar29 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                      ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                    *)&local_f0);
            pvVar17 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                      ::get<true>(&(pLVar29->super_LogicalJoin).super_LogicalOperator.children,0);
            pLVar29 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                      ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                    *)&local_f0);
            __b = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                  ::get<true>(&(pLVar29->super_LogicalJoin).super_LogicalOperator.children,1);
            ::std::
            swap<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                      (pvVar17,__b);
            goto LAB_012259dd;
          }
        }
        pEVar27 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              *)(local_108 + 0x10));
        if ((pEVar27->super_BaseExpression).expression_class == BOUND_COMPARISON) {
          local_90._M_head_impl = (Expression *)local_108._16_8_;
          local_108._16_8_ = (Expression *)0x0;
          MaybeInvertConditions
                    (&cond,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)&local_90,bVar12);
          if (local_90._M_head_impl != (Expression *)0x0) {
            (*((local_90._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
          }
          local_90._M_head_impl = (Expression *)0x0;
          pLVar29 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                    ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                  *)&local_f0);
          ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::
          emplace_back<duckdb::JoinCondition>
                    (&(pLVar29->conditions).
                      super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>,
                     &cond);
          JoinCondition::~JoinCondition(&cond);
        }
        else {
          pEVar27 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)(local_108 + 0x10));
          if ((pEVar27->super_BaseExpression).expression_class == BOUND_CONJUNCTION) {
            pEVar27 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                    *)(local_108 + 0x10));
            pBVar21 = BaseExpression::Cast<duckdb::BoundConjunctionExpression>
                                (&pEVar27->super_BaseExpression);
            puVar3 = (pBVar21->children).
                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (puVar30 = (pBVar21->children).
                           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; puVar30 != puVar3;
                puVar30 = puVar30 + 1) {
              local_98._M_head_impl =
                   (puVar30->
                   super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
                   _M_t.
                   super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                   .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
              (puVar30->
              super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
              super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
              _M_t.
              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
              MaybeInvertConditions
                        (&cond,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)&local_98,bVar12);
              if (local_98._M_head_impl != (Expression *)0x0) {
                (*((local_98._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
              }
              local_98._M_head_impl = (Expression *)0x0;
              pLVar29 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                        ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                      *)&local_f0);
              ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::
              emplace_back<duckdb::JoinCondition>
                        (&(pLVar29->conditions).
                          super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                         ,&cond);
              JoinCondition::~JoinCondition(&cond);
            }
          }
        }
        if ((Expression *)local_108._16_8_ != (Expression *)0x0) {
          (*((BaseExpression *)local_108._16_8_)->_vptr_BaseExpression[1])();
        }
      }
      local_f0._M_head_impl = (LogicalComparisonJoin *)0x0;
      local_110._M_head_impl = (LogicalOperator *)_Var9._M_head_impl;
      if ((_Var32._M_head_impl != (LogicalOperator *)0x0) &&
         ((**(code **)((long)(((unsafe_unique_array<idx_t> *)
                              &(_Var32._M_head_impl)->_vptr_LogicalOperator)->
                             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                             )._M_t.
                             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                      + 8))(), (ClientContext *)local_f0._M_head_impl != (ClientContext *)0x0)) {
        (*(*(_func_int ***)
            &((original *)
             &((local_f0._M_head_impl)->super_LogicalJoin).super_LogicalOperator.
              _vptr_LogicalOperator)->
             super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>)[1])();
      }
    }
    left_node.ptr = (JoinRelationSet *)local_108._0_8_;
    right_node.ptr = (JoinRelationSet *)local_e8._0_8_;
    pJVar16 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*
                        ((optional_ptr<duckdb::JoinRelationSet,_true> *)local_108);
    pJVar26 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*
                        ((optional_ptr<duckdb::JoinRelationSet,_true> *)local_e8);
    result_relation.ptr =
         JoinRelationSetManager::Union
                   ((JoinRelationSetManager *)(extracted_relations + 6),pJVar16,pJVar26);
    _Var32._M_head_impl = (LogicalOperator *)local_108._8_8_;
    if ((LogicalOperator *)local_e8._8_8_ != (LogicalOperator *)0x0) {
      (*(code *)(*(_Hash_node_base **)local_e8._8_8_)[1]._M_nxt)();
      _Var32._M_head_impl = (LogicalOperator *)local_108._8_8_;
    }
  }
  else {
    pDVar15 = unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::
              operator->(this_04);
    result_relation.ptr = pDVar15->set;
    pJVar16 = optional_ptr<duckdb::JoinRelationSet,_true>::operator->(&result_relation);
    pvVar17 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
              ::get<true>((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                           *)set,*(unsigned_long *)
                                  (pJVar16->relations).
                                  super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                  ._M_t.
                                  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                  .super__Head_base<0UL,_unsigned_long_*,_false>);
    _Var33._M_head_impl =
         (pvVar17->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (pvVar17->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    _Var32._M_head_impl = local_110._M_head_impl;
    local_110._M_head_impl = _Var33._M_head_impl;
  }
  if (_Var32._M_head_impl != (LogicalOperator *)0x0) {
    (**(code **)((long)(((unsafe_unique_array<idx_t> *)&(_Var32._M_head_impl)->_vptr_LogicalOperator
                        )->super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)
                       ._M_t.
                       super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false> + 8))();
  }
  pDVar15 = unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::
            operator->(this_04);
  iVar4 = pDVar15->cardinality;
  pLVar22 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                          *)&local_110);
  pLVar22->estimated_cardinality = iVar4;
  pLVar22 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                          *)&local_110);
  pLVar22->has_estimated_cardinality = true;
  this_00 = &extracted_relations[10].
             super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  this_03 = (unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true> *)
            extracted_relations[10].
            super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  puVar5 = (unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true> *)
           extracted_relations[10].
           super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  do {
    if (this_03 == puVar5) {
      (this->relation_manager).relation_mapping._M_h._M_buckets = (__buckets_ptr)result_relation.ptr
      ;
      (this->relation_manager).relation_mapping._M_h._M_bucket_count =
           (size_type)local_110._M_head_impl;
      GVar35.op.
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           result_relation.ptr;
      GVar35.set.ptr = (JoinRelationSet *)this;
      return GVar35;
    }
    pFVar23 = unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>::
              operator*(this_03);
    pvVar24 = vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_true>
              ::get<true>((vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_true>
                           *)this_00,pFVar23->filter_index);
    pFVar25 = unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>::
              operator->(pvVar24);
    if (((Expression *)
         (pFVar25->filter).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false> != (Expression *)0x0) &&
       (((pFVar23->set)._M_data)->count != 0)) {
      pJVar16 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*(&result_relation);
      bVar12 = JoinRelationSet::IsSubset(pJVar16,(pFVar23->set)._M_data);
      if (bVar12) {
        pvVar24 = vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_true>
                  ::get<true>((vector<duckdb::unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>,_true>
                               *)this_00,pFVar23->filter_index);
        pFVar25 = unique_ptr<duckdb::FilterInfo,_std::default_delete<duckdb::FilterInfo>,_true>::
                  operator->(pvVar24);
        _Var6.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (pFVar25->filter).
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>;
        (pFVar25->filter).
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false> =
             (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
        if ((left_node.ptr == (JoinRelationSet *)0x0) ||
           ((pFVar23->left_set).ptr == (JoinRelationSet *)0x0)) {
          local_a0._M_nxt = (_Hash_node_base *)local_110._M_head_impl;
          local_110._M_head_impl = (LogicalOperator *)0x0;
          local_108._0_8_ = (Expression *)0x0;
          local_a8 = _Var6.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          PushFilter((duckdb *)&cond,
                     (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                      *)&local_a0,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&local_a8);
          _Var32._M_head_impl = local_110._M_head_impl;
          local_110._M_head_impl =
               (LogicalOperator *)
               cond.left.
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          if (_Var32._M_head_impl != (LogicalOperator *)0x0) {
            (*(_Var32._M_head_impl)->_vptr_LogicalOperator[1])();
          }
          if (local_a8._M_head_impl != (Expression *)0x0) {
            (*((local_a8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
          }
          local_a8._M_head_impl = (Expression *)0x0;
          if ((LogicalOperator *)local_a0._M_nxt != (LogicalOperator *)0x0) {
            (*(code *)(local_a0._M_nxt)->_M_nxt[1]._M_nxt)();
          }
          local_a0._M_nxt = (_Hash_node_base *)0x0;
        }
        else {
          local_108._0_8_ = _Var6.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          pJVar16 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*(&left_node);
          pJVar26 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*(&pFVar23->left_set);
          bVar12 = JoinRelationSet::IsSubset(pJVar16,pJVar26);
          if (bVar12) {
            pJVar16 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*(&right_node);
            pJVar26 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*(&pFVar23->right_set);
            bVar12 = JoinRelationSet::IsSubset(pJVar16,pJVar26);
            if (!bVar12) goto LAB_01225d67;
            bVar31 = 0;
LAB_01225dc4:
            cond.left.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
                 (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
                  )0x0;
            cond.right.
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
                 (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
                  )0x0;
            pEVar27 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                    *)local_108);
            pBVar28 = BaseExpression::Cast<duckdb::BoundComparisonExpression>
                                (&pEVar27->super_BaseExpression);
            _Var7._M_head_impl =
                 (&pBVar28->left)[bVar31].
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
                 .
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            (&pBVar28->left)[bVar31].
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
            if (cond.left.
                super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
                super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                _M_t.
                super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
                (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
                 )0x0) {
              lVar8 = *(long *)cond.left.
                               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                               ._M_t.
                               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
              cond.left.
              super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
              super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
              _M_t.
              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
                   _Var7._M_head_impl;
              (**(code **)(lVar8 + 8))();
              _Var7._M_head_impl =
                   (Expression *)
                   cond.left.
                   super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                   _M_t.
                   super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                   .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            }
            cond.left.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
                 _Var7._M_head_impl;
            _Var7._M_head_impl =
                 (&pBVar28->left)[bVar31 ^ 1].
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
                 .
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            (&pBVar28->left)[bVar31 ^ 1].
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
            if (cond.right.
                super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
                super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                _M_t.
                super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
                (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
                 )0x0) {
              lVar8 = *(long *)cond.right.
                               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                               ._M_t.
                               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
              cond.right.
              super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
              super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
              _M_t.
              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
                   _Var7._M_head_impl;
              (**(code **)(lVar8 + 8))();
              _Var7._M_head_impl =
                   (Expression *)
                   cond.right.
                   super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                   _M_t.
                   super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                   .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            }
            cond.right.
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
                 _Var7._M_head_impl;
            cond.comparison = (pBVar28->super_Expression).super_BaseExpression.type;
            if (bVar31 != 0) {
              cond.comparison = FlipComparisonExpression(cond.comparison);
            }
            LVar13 = *(LogicalOperatorType *)
                      &((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&(local_110._M_head_impl)->type)
                       ->_M_pi;
            _Var32._M_head_impl = local_110._M_head_impl;
            if (LVar13 == LOGICAL_FILTER) {
              pvVar17 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                        ::get<true>(&(local_110._M_head_impl)->children,0);
              _Var32._M_head_impl =
                   (pvVar17->
                   super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                   )._M_t.
                   super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                   .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
              LVar13 = (_Var32._M_head_impl)->type;
            }
            if (LVar13 == LOGICAL_CROSS_PRODUCT) {
              chosen_filter.ptr._0_1_ = 3;
              make_uniq<duckdb::LogicalComparisonJoin,duckdb::JoinType>
                        ((duckdb *)local_e8,(JoinType *)&chosen_filter);
              pLVar29 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                        ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                      *)local_e8);
              pvVar17 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                        ::get<true>((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                                     *)&((ClientContext *)_Var32._M_head_impl)->db,0);
              ::std::
              vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                          *)&(pLVar29->super_LogicalJoin).super_LogicalOperator.children,pvVar17);
              pLVar29 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                        ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                      *)local_e8);
              pvVar17 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                        ::get<true>((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                                     *)&((ClientContext *)_Var32._M_head_impl)->db,1);
              ::std::
              vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                          *)&(pLVar29->super_LogicalJoin).super_LogicalOperator.children,pvVar17);
              pLVar29 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                        ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                      *)local_e8);
              ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::
              emplace_back<duckdb::JoinCondition>
                        (&(pLVar29->conditions).
                          super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                         ,&cond);
              uVar10 = local_e8._0_8_;
              _Var33._M_head_impl = local_110._M_head_impl;
              local_e8._0_8_ = (LogicalOperator *)0x0;
              if (_Var32._M_head_impl == local_110._M_head_impl) {
                local_110._M_head_impl = (LogicalOperator *)uVar10;
LAB_01225fd4:
                (*(*(_func_int ***)
                    &(((ClientContext *)_Var33._M_head_impl)->
                     super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_)[1])();
              }
              else {
                pLVar22 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                          ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                                        *)&local_110);
                pvVar17 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                          ::get<true>(&pLVar22->children,0);
                _Var33._M_head_impl =
                     (pvVar17->
                     super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                     )._M_t.
                     super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                     .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
                (pvVar17->
                super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                )._M_t.
                super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
                     (LogicalOperator *)uVar10;
                if (_Var33._M_head_impl != (LogicalOperator *)0x0) goto LAB_01225fd4;
              }
              if ((LogicalOperator *)local_e8._0_8_ != (LogicalOperator *)0x0) {
                (**(_func_int **)
                   ((long)(((unsafe_unique_array<idx_t> *)local_e8._0_8_)->
                          super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>).
                          _M_t.
                          super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                          .super__Head_base<0UL,_unsigned_long_*,_false> + 8))();
              }
            }
            else {
              ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::
              emplace_back<duckdb::JoinCondition>
                        ((vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_> *)
                         &(((ClientContext *)_Var32._M_head_impl)->config).emit_profiler_output,
                         &cond);
            }
            JoinCondition::~JoinCondition(&cond);
          }
          else {
LAB_01225d67:
            pJVar16 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*(&right_node);
            pJVar26 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*(&pFVar23->left_set);
            bVar12 = JoinRelationSet::IsSubset(pJVar16,pJVar26);
            if (bVar12) {
              pJVar16 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*(&left_node);
              pJVar26 = optional_ptr<duckdb::JoinRelationSet,_true>::operator*(&pFVar23->right_set);
              bVar12 = JoinRelationSet::IsSubset(pJVar16,pJVar26);
              bVar31 = 1;
              if (bVar12) goto LAB_01225dc4;
            }
            local_b0._M_head_impl = local_110._M_head_impl;
            local_110._M_head_impl = (LogicalOperator *)0x0;
            local_b8._M_head_impl = (Expression *)local_108._0_8_;
            local_108._0_8_ = (Expression *)0x0;
            PushFilter((duckdb *)&cond,
                       (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                        *)&local_b0,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)&local_b8);
            _Var32._M_head_impl = local_110._M_head_impl;
            local_110._M_head_impl =
                 (LogicalOperator *)
                 cond.left.
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
                 .
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            if (_Var32._M_head_impl != (LogicalOperator *)0x0) {
              (*(_Var32._M_head_impl)->_vptr_LogicalOperator[1])();
            }
            if (local_b8._M_head_impl != (Expression *)0x0) {
              (*((local_b8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
            }
            local_b8._M_head_impl = (Expression *)0x0;
            if ((ClientContext *)local_b0._M_head_impl != (ClientContext *)0x0) {
              (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)
                           &(local_b0._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).internal.
                          super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         )->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                        internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)();
            }
            local_b0._M_head_impl = (LogicalOperator *)0x0;
          }
        }
        if ((Expression *)local_108._0_8_ != (Expression *)0x0) {
          (*((BaseExpression *)local_108._0_8_)->_vptr_BaseExpression[1])();
        }
      }
    }
    this_03 = this_03 + 1;
  } while( true );
}

Assistant:

GenerateJoinRelation QueryGraphManager::GenerateJoins(vector<unique_ptr<LogicalOperator>> &extracted_relations,
                                                      JoinRelationSet &set) {
	optional_ptr<JoinRelationSet> left_node;
	optional_ptr<JoinRelationSet> right_node;
	optional_ptr<JoinRelationSet> result_relation;
	unique_ptr<LogicalOperator> result_operator;

	auto dp_entry = plans->find(set);
	if (dp_entry == plans->end()) {
		throw InternalException("Join Order Optimizer Error: No full plan was created");
	}
	auto &node = dp_entry->second;
	if (!dp_entry->second->is_leaf) {

		// generate the left and right children
		auto left = GenerateJoins(extracted_relations, node->left_set);
		auto right = GenerateJoins(extracted_relations, node->right_set);
		if (dp_entry->second->info->filters.empty()) {
			// no filters, create a cross product
			auto cardinality = left.op->estimated_cardinality * right.op->estimated_cardinality;
			result_operator = LogicalCrossProduct::Create(std::move(left.op), std::move(right.op));
			result_operator->SetEstimatedCardinality(cardinality);
		} else {
			// we have filters, create a join node
			auto chosen_filter = node->info->filters.at(0);
			for (idx_t i = 0; i < node->info->filters.size(); i++) {
				if (node->info->filters.at(i)->join_type == JoinType::INNER) {
					chosen_filter = node->info->filters.at(i);
					break;
				}
			}
			auto join = make_uniq<LogicalComparisonJoin>(chosen_filter->join_type);
			// Here we optimize build side probe side. Our build side is the right side
			// So the right plans should have lower cardinalities.
			join->children.push_back(std::move(left.op));
			join->children.push_back(std::move(right.op));

			// set the join conditions from the join node
			for (auto &filter_ref : node->info->filters) {
				auto f = filter_ref.get();
				// extract the filter from the operator it originally belonged to
				D_ASSERT(filters_and_bindings[f->filter_index]->filter);
				auto &filter_and_binding = filters_and_bindings.at(f->filter_index);
				auto condition = std::move(filter_and_binding->filter);
				// now create the actual join condition
				D_ASSERT((JoinRelationSet::IsSubset(*left.set, *f->left_set) &&
				          JoinRelationSet::IsSubset(*right.set, *f->right_set)) ||
				         (JoinRelationSet::IsSubset(*left.set, *f->right_set) &&
				          JoinRelationSet::IsSubset(*right.set, *f->left_set)));

				bool invert = !JoinRelationSet::IsSubset(*left.set, *f->left_set);
				// If the left and right set are inverted AND it is a semi or anti join
				// swap left and right children back.

				if (invert && (f->join_type == JoinType::SEMI || f->join_type == JoinType::ANTI)) {
					std::swap(join->children[0], join->children[1]);
					invert = false;
				}

				if (condition->GetExpressionClass() == ExpressionClass::BOUND_COMPARISON) {
					auto cond = MaybeInvertConditions(std::move(condition), invert);
					join->conditions.push_back(std::move(cond));
				} else if (condition->GetExpressionClass() == ExpressionClass::BOUND_CONJUNCTION) {
					auto &conjunction = condition->Cast<BoundConjunctionExpression>();
					for (auto &child : conjunction.children) {
						D_ASSERT(child->GetExpressionClass() == ExpressionClass::BOUND_COMPARISON);
						auto cond = MaybeInvertConditions(std::move(child), invert);
						join->conditions.push_back(std::move(cond));
					}
				}
			}
			D_ASSERT(!join->conditions.empty());
			result_operator = std::move(join);
		}
		left_node = left.set;
		right_node = right.set;
		result_relation = &set_manager.Union(*left.set, *right.set);
	} else {
		// base node, get the entry from the list of extracted relations
		D_ASSERT(node->set.count == 1);
		D_ASSERT(extracted_relations[node->set.relations[0]]);
		result_relation = &node->set;
		result_operator = std::move(extracted_relations[result_relation->relations[0]]);
	}
	// TODO: this is where estimated properties start coming into play.
	//  when creating the result operator, we should ask the cost model and cardinality estimator what
	//  the cost and cardinality are
	//	result_operator->estimated_props = node.estimated_props->Copy();
	result_operator->estimated_cardinality = node->cardinality;
	result_operator->has_estimated_cardinality = true;
	// check if we should do a pushdown on this node
	// basically, any remaining filter that is a subset of the current relation will no longer be used in joins
	// hence we should push it here
	for (auto &filter_info : filters_and_bindings) {
		// check if the filter has already been extracted
		auto &info = *filter_info;
		if (filters_and_bindings[info.filter_index]->filter) {
			// now check if the filter is a subset of the current relation
			// note that infos with an empty relation set are a special case and we do not push them down
			if (info.set.get().count > 0 && JoinRelationSet::IsSubset(*result_relation, info.set)) {
				auto &filter_and_binding = filters_and_bindings[info.filter_index];
				auto filter = std::move(filter_and_binding->filter);
				// if it is, we can push the filter
				// we can push it either into a join or as a filter
				// check if we are in a join or in a base table
				if (!left_node || !info.left_set) {
					// base table or non-comparison expression, push it as a filter
					result_operator = PushFilter(std::move(result_operator), std::move(filter));
					continue;
				}
				// the node below us is a join or cross product and the expression is a comparison
				// check if the nodes can be split up into left/right
				bool found_subset = false;
				bool invert = false;
				if (JoinRelationSet::IsSubset(*left_node, *info.left_set) &&
				    JoinRelationSet::IsSubset(*right_node, *info.right_set)) {
					found_subset = true;
				} else if (JoinRelationSet::IsSubset(*right_node, *info.left_set) &&
				           JoinRelationSet::IsSubset(*left_node, *info.right_set)) {
					invert = true;
					found_subset = true;
				}
				if (!found_subset) {
					// could not be split up into left/right
					result_operator = PushFilter(std::move(result_operator), std::move(filter));
					continue;
				}
				// create the join condition
				JoinCondition cond;
				D_ASSERT(filter->GetExpressionClass() == ExpressionClass::BOUND_COMPARISON);
				auto &comparison = filter->Cast<BoundComparisonExpression>();
				// we need to figure out which side is which by looking at the relations available to us
				cond.left = !invert ? std::move(comparison.left) : std::move(comparison.right);
				cond.right = !invert ? std::move(comparison.right) : std::move(comparison.left);
				cond.comparison = comparison.GetExpressionType();
				if (invert) {
					// reverse comparison expression if we reverse the order of the children
					cond.comparison = FlipComparisonExpression(comparison.GetExpressionType());
				}
				// now find the join to push it into
				auto node = result_operator.get();
				if (node->type == LogicalOperatorType::LOGICAL_FILTER) {
					node = node->children[0].get();
				}
				if (node->type == LogicalOperatorType::LOGICAL_CROSS_PRODUCT) {
					// turn into comparison join
					auto comp_join = make_uniq<LogicalComparisonJoin>(JoinType::INNER);
					comp_join->children.push_back(std::move(node->children[0]));
					comp_join->children.push_back(std::move(node->children[1]));
					comp_join->conditions.push_back(std::move(cond));
					if (node == result_operator.get()) {
						result_operator = std::move(comp_join);
					} else {
						D_ASSERT(result_operator->type == LogicalOperatorType::LOGICAL_FILTER);
						result_operator->children[0] = std::move(comp_join);
					}
				} else {
					D_ASSERT(node->type == LogicalOperatorType::LOGICAL_COMPARISON_JOIN ||
					         node->type == LogicalOperatorType::LOGICAL_ASOF_JOIN);
					auto &comp_join = node->Cast<LogicalComparisonJoin>();
					comp_join.conditions.push_back(std::move(cond));
				}
			}
		}
	}
	auto result = GenerateJoinRelation(result_relation, std::move(result_operator));
	return result;
}